

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

float __thiscall cnn::Model::gradient_l2_norm(Model *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  long *plVar3;
  long lVar4;
  float *pfVar5;
  ulong uVar6;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *__range1;
  uint uVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  
  if (this->gradient_norm_scratch == (float *)0x0) {
    pfVar5 = (float *)(**(code **)(**(long **)(default_device + 0x10) + 0x10))
                                (*(long **)(default_device + 0x10),
                                 (long)(this->all_params).
                                       super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->all_params).
                                       super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 1);
    this->gradient_norm_scratch = pfVar5;
  }
  ppPVar1 = (this->all_params).
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar2 = (this->all_params).
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar1 == ppPVar2) {
    uVar7 = 0;
  }
  else {
    lVar8 = 0;
    uVar7 = 0;
    lVar9 = 0;
    do {
      plVar3 = *(long **)((long)ppPVar1 + lVar9 * 2);
      (**(code **)(*plVar3 + 0x10))(plVar3,(long)this->gradient_norm_scratch + lVar9);
      lVar9 = lVar9 + 4;
      uVar7 = uVar7 + 1;
      lVar4 = lVar8 + 8;
      lVar8 = lVar8 + 8;
    } while ((pointer)((long)ppPVar1 + lVar4) != ppPVar2);
  }
  dVar10 = 0.0;
  if (uVar7 != 0) {
    uVar6 = 0;
    do {
      dVar10 = dVar10 + (double)this->gradient_norm_scratch[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  return (float)dVar10;
}

Assistant:

float Model::gradient_l2_norm() const {
  if (!gradient_norm_scratch)
    gradient_norm_scratch = (float*)default_device->mem->malloc(all_params.size() * sizeof(float));
  int pi = 0;
  for (auto p : all_params) {
    p->g_squared_l2norm(&gradient_norm_scratch[pi]);
    ++pi;
  }
#if HAVE_CUDA
  float res = 0;
  gpu::l2_norm_reducer(all_params.size(), gradient_norm_scratch, gradient_norm_scratch, false, false);
  cudaMemcpy(&res, gradient_norm_scratch, sizeof(float),  cudaMemcpyDeviceToHost);
  return sqrt(res);
#else
  double gg = 0;
  for (int i = 0; i < pi; ++i)
    gg += gradient_norm_scratch[i];
  return sqrt(gg);
#endif
}